

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O0

cc_bool PopDescriptor(KosinskiDecompressCallbacks *callbacks)

{
  uint uVar1;
  cc_bool result;
  KosinskiDecompressCallbacks *callbacks_local;
  
  uVar1 = descriptor & 1;
  descriptor = descriptor >> 1;
  descriptor_bits_remaining = descriptor_bits_remaining - 1;
  if (descriptor_bits_remaining == 0) {
    GetDescriptor(callbacks);
  }
  return uVar1 != 0;
}

Assistant:

static cc_bool PopDescriptor(const KosinskiDecompressCallbacks* const callbacks)
{
	const cc_bool result = (descriptor & 1) != 0;

	descriptor >>= 1;

	if (--descriptor_bits_remaining == 0)
		GetDescriptor(callbacks);

	return result;
}